

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O2

FilePath * __thiscall
testing::internal::FilePath::RemoveExtension
          (FilePath *__return_storage_ptr__,FilePath *this,char *extension)

{
  bool bVar1;
  string dot_extension;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string((string *)&local_58,".",&local_59);
  std::operator+(&local_38,&local_58,extension);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = String::EndsWithCaseInsensitive(&this->pathname_,&local_38);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)&local_58,(ulong)this);
    FilePath(__return_storage_ptr__,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveExtension(const char* extension) const {
  const std::string dot_extension = std::string(".") + extension;
  if (String::EndsWithCaseInsensitive(pathname_, dot_extension)) {
    return FilePath(pathname_.substr(
        0, pathname_.length() - dot_extension.length()));
  }
  return *this;
}